

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

bool __thiscall Js::JavascriptArray::BigIndex::operator<=(BigIndex *this,BigIndex *rhs)

{
  uint32 uVar1;
  uint32 uVar2;
  ulong uVar3;
  uint64 uVar4;
  bool bVar5;
  bool bVar6;
  
  if (rhs->index == 0xffffffff) {
    if (this->index == 0xffffffff) {
      uVar1 = GetSmallIndex(this);
      uVar4 = GetBigIndex(rhs);
      return uVar1 <= uVar4;
    }
    uVar4 = GetBigIndex(this);
    uVar3 = GetBigIndex(rhs);
  }
  else {
    if (this->index != 0xffffffff) {
      uVar1 = GetSmallIndex(this);
      uVar2 = GetSmallIndex(rhs);
      bVar5 = uVar1 < uVar2;
      bVar6 = uVar1 == uVar2;
      goto LAB_00b835c7;
    }
    uVar4 = GetBigIndex(this);
    uVar1 = GetSmallIndex(rhs);
    uVar3 = (ulong)uVar1;
  }
  bVar5 = uVar4 < uVar3;
  bVar6 = uVar4 == uVar3;
LAB_00b835c7:
  return bVar5 || bVar6;
}

Assistant:

bool JavascriptArray::BigIndex::operator<=(const BigIndex& rhs) const
    {
        if (rhs.IsSmallIndex() && this->IsSmallIndex())
        {
            return this->GetSmallIndex() <= rhs.GetSmallIndex();
        }
        else if (rhs.IsSmallIndex() && !this->IsSmallIndex())
        {
            // if lhs is big promote rhs
            return this->GetBigIndex() <= (uint64)rhs.GetSmallIndex();
        }
        else if (!rhs.IsSmallIndex() && !this->IsSmallIndex())
        {
            // if rhs is big promote lhs
            return ((uint64)this->GetSmallIndex()) <= rhs.GetBigIndex();
        }
        return this->GetBigIndex() <= rhs.GetBigIndex();
    }